

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O1

void alEventControlSOFT(ALsizei count,ALenum *types,ALboolean enable)

{
  uint *puVar1;
  uint uVar2;
  ALbitfieldSOFT enabledevts;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint *puVar7;
  uint *puVar8;
  bool bVar9;
  ContextRef context;
  ALCcontext *local_20;
  
  GetContextRef();
  if (local_20 == (ALCcontext *)0x0) goto LAB_0011f524;
  if (count < 0) {
    ALCcontext::setError(local_20,0xa003,"Controlling %d events");
  }
  if (count < 1) goto LAB_0011f524;
  if (types == (ALenum *)0x0) {
    ALCcontext::setError(local_20,0xa003,"NULL pointer");
    goto LAB_0011f524;
  }
  puVar1 = (uint *)(types + (uint)count);
  uVar5 = 0;
  puVar7 = (uint *)types;
  if (3 < (uint)count) {
    puVar7 = (uint *)(types + (count & 0x7ffffffc));
    lVar6 = (ulong)((uint)count >> 2) + 1;
    puVar8 = (uint *)(types + 2);
    uVar5 = 0;
    do {
      if (2 < puVar8[-2] - 0x19a4) {
        puVar8 = puVar8 + -2;
        goto LAB_0011f4ab;
      }
      uVar5 = uVar5 | *(uint *)(&DAT_001738f0 + (ulong)(puVar8[-2] - 0x19a4) * 4);
      if (2 < puVar8[-1] - 0x19a4) {
        puVar8 = puVar8 + -1;
        goto LAB_0011f4ab;
      }
      uVar5 = uVar5 | *(uint *)(&DAT_001738f0 + (ulong)(puVar8[-1] - 0x19a4) * 4);
      if (2 < *puVar8 - 0x19a4) goto LAB_0011f4ab;
      uVar5 = uVar5 | *(uint *)(&DAT_001738f0 + (ulong)(*puVar8 - 0x19a4) * 4);
      if (2 < puVar8[1] - 0x19a4) {
        puVar8 = puVar8 + 1;
        goto LAB_0011f4ab;
      }
      uVar5 = uVar5 | *(uint *)(&DAT_001738f0 + (ulong)(puVar8[1] - 0x19a4) * 4);
      lVar6 = lVar6 + -1;
      puVar8 = puVar8 + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)puVar1 - (long)puVar7 >> 2;
  if (lVar6 == 1) {
LAB_0011f3ba:
    uVar3 = *puVar7;
    if (uVar3 == 0x19a6) {
      uVar5 = uVar5 | 4;
      puVar8 = puVar1;
    }
    else if (uVar3 == 0x19a5) {
      uVar5 = uVar5 | 1;
      puVar8 = puVar1;
    }
    else {
      puVar8 = puVar7;
      if (uVar3 == 0x19a4) {
        uVar5 = uVar5 | 2;
        puVar8 = puVar1;
      }
    }
  }
  else if (lVar6 == 2) {
LAB_0011f399:
    puVar8 = puVar7;
    if (*puVar7 - 0x19a4 < 3) {
      uVar5 = uVar5 | *(uint *)(&DAT_001738f0 + (ulong)(*puVar7 - 0x19a4) * 4);
      puVar7 = puVar7 + 1;
      goto LAB_0011f3ba;
    }
  }
  else {
    puVar8 = puVar1;
    if ((lVar6 == 3) && (puVar8 = puVar7, *puVar7 - 0x19a4 < 3)) {
      uVar5 = uVar5 | *(uint *)(&DAT_001738f0 + (ulong)(*puVar7 - 0x19a4) * 4);
      puVar7 = puVar7 + 1;
      goto LAB_0011f399;
    }
  }
LAB_0011f4ab:
  if (puVar8 == puVar1) {
    uVar3 = (local_20->mEnabledEvts).super___atomic_base<unsigned_int>._M_i;
    if (enable == '\0') {
      do {
        LOCK();
        uVar2 = (local_20->mEnabledEvts).super___atomic_base<unsigned_int>._M_i;
        bVar9 = uVar3 == uVar2;
        if (bVar9) {
          (local_20->mEnabledEvts).super___atomic_base<unsigned_int>._M_i = uVar3 & ~uVar5;
          uVar2 = uVar3;
        }
        uVar3 = uVar2;
        UNLOCK();
      } while (!bVar9);
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)&local_20->mEventCbLock);
      if (iVar4 != 0) {
        std::__throw_system_error(iVar4);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&local_20->mEventCbLock);
    }
    else {
      do {
        LOCK();
        uVar2 = (local_20->mEnabledEvts).super___atomic_base<unsigned_int>._M_i;
        bVar9 = uVar3 == uVar2;
        if (bVar9) {
          (local_20->mEnabledEvts).super___atomic_base<unsigned_int>._M_i = uVar3 | uVar5;
          uVar2 = uVar3;
        }
        uVar3 = uVar2;
        UNLOCK();
      } while (!bVar9);
    }
  }
  else {
    ALCcontext::setError(local_20,0xa002,"Invalid event type 0x%04x",(ulong)*puVar8);
  }
LAB_0011f524:
  if (local_20 != (ALCcontext *)0x0) {
    al::intrusive_ref<ALCcontext>::release(&local_20->super_intrusive_ref<ALCcontext>);
  }
  return;
}

Assistant:

AL_API void AL_APIENTRY alEventControlSOFT(ALsizei count, const ALenum *types, ALboolean enable)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    if(count < 0) context->setError(AL_INVALID_VALUE, "Controlling %d events", count);
    if(count <= 0) return;
    if(!types) SETERR_RETURN(context, AL_INVALID_VALUE,, "NULL pointer");

    ALbitfieldSOFT flags{0};
    const ALenum *types_end = types+count;
    auto bad_type = std::find_if_not(types, types_end,
        [&flags](ALenum type) noexcept -> bool
        {
            if(type == AL_EVENT_TYPE_BUFFER_COMPLETED_SOFT)
                flags |= EventType_BufferCompleted;
            else if(type == AL_EVENT_TYPE_SOURCE_STATE_CHANGED_SOFT)
                flags |= EventType_SourceStateChange;
            else if(type == AL_EVENT_TYPE_DISCONNECTED_SOFT)
                flags |= EventType_Disconnected;
            else
                return false;
            return true;
        }
    );
    if(bad_type != types_end)
        SETERR_RETURN(context, AL_INVALID_ENUM,, "Invalid event type 0x%04x", *bad_type);

    if(enable)
    {
        ALbitfieldSOFT enabledevts{context->mEnabledEvts.load(std::memory_order_relaxed)};
        while(context->mEnabledEvts.compare_exchange_weak(enabledevts, enabledevts|flags,
            std::memory_order_acq_rel, std::memory_order_acquire) == 0)
        {
            /* enabledevts is (re-)filled with the current value on failure, so
             * just try again.
             */
        }
    }
    else
    {
        ALbitfieldSOFT enabledevts{context->mEnabledEvts.load(std::memory_order_relaxed)};
        while(context->mEnabledEvts.compare_exchange_weak(enabledevts, enabledevts&~flags,
            std::memory_order_acq_rel, std::memory_order_acquire) == 0)
        {
        }
        /* Wait to ensure the event handler sees the changed flags before
         * returning.
         */
        std::lock_guard<std::mutex>{context->mEventCbLock};
    }
}